

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[42],kj::_::DebugComparison<char16_t&,char16_t_const&>&,unsigned_long&,kj::CappedArray<char,5ul>,kj::CappedArray<char,5ul>>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [42],
               DebugComparison<char16_t_&,_const_char16_t_&> *params_1,unsigned_long *params_2,
               CappedArray<char,_5UL> *params_3,CappedArray<char,_5UL> *params_4)

{
  undefined4 in_register_00000014;
  DebugComparison<char16_t_&,_const_char16_t_&> *params_00;
  unsigned_long *params_01;
  CappedArray<char,_5UL> *params_02;
  CappedArray<char,_5UL> *params_03;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffec8;
  ArrayDisposer **local_100;
  undefined1 local_a8 [8];
  String argValues [5];
  DebugComparison<char16_t_&,_const_char16_t_&> *params_local_1;
  char (*params_local) [42];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  argValues[4].content.disposer = (ArrayDisposer *)params_1;
  str<char_const(&)[42]>
            ((String *)local_a8,(kj *)params,(char (*) [42])CONCAT44(in_register_00000014,severity))
  ;
  str<kj::_::DebugComparison<char16_t&,char16_t_const&>&>
            ((String *)&argValues[0].content.disposer,(kj *)argValues[4].content.disposer,params_00)
  ;
  str<unsigned_long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<kj::CappedArray<char,5ul>&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02)
  ;
  str<kj::CappedArray<char,5ul>&>((String *)&argValues[3].content.disposer,(kj *)params_4,params_03)
  ;
  AVar1 = arrayPtr<kj::String>((String *)local_a8,5);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffec8);
  local_100 = &argValues[4].content.disposer;
  do {
    local_100 = local_100 + -3;
    String::~String((String *)local_100);
  } while (local_100 != (ArrayDisposer **)local_a8);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}